

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_bps(test_state *state)

{
  int iVar1;
  test_state *in_RDI;
  int bps;
  int status;
  int k;
  test_state *in_stack_ffffffffffffffd8;
  uint k_00;
  uint in_stack_ffffffffffffffec;
  
  k_00 = 8;
  while( true ) {
    if (0x20 < (int)k_00) {
      return 0;
    }
    in_RDI->strm->bits_per_sample = k_00;
    if (k_00 == 0x18) {
      in_RDI->strm->flags = in_RDI->strm->flags | 2;
    }
    else {
      in_RDI->strm->flags = in_RDI->strm->flags & 0xfffffffd;
    }
    update_state(in_RDI);
    iVar1 = check_zero(in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = check_se((test_state *)((ulong)in_stack_ffffffffffffffec << 0x20));
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = check_uncompressed((test_state *)((ulong)in_stack_ffffffffffffffec << 0x20));
    if (iVar1 != 0) break;
    iVar1 = check_fs((test_state *)((ulong)in_stack_ffffffffffffffec << 0x20));
    if (iVar1 != 0) {
      return iVar1;
    }
    for (in_stack_ffffffffffffffec = 1; (int)in_stack_ffffffffffffffec < (int)(k_00 - 2);
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1) {
      iVar1 = check_splitting((test_state *)((ulong)in_stack_ffffffffffffffec << 0x20),k_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    printf("All checks with %i bit per sample passed.\n",(ulong)k_00);
    k_00 = k_00 + 8;
  }
  return iVar1;
}

Assistant:

int check_bps(struct test_state *state)
{
    int k, status, bps;

    for (bps = 8; bps <= 32; bps += 8) {
        state->strm->bits_per_sample = bps;
        if (bps == 24)
            state->strm->flags |= AEC_DATA_3BYTE;
        else
            state->strm->flags &= ~AEC_DATA_3BYTE;

        update_state(state);

        status = check_zero(state);
        if (status)
            return status;

        status = check_se(state);
        if (status)
            return status;

        status = check_uncompressed(state);
        if (status)
            return status;

        status = check_fs(state);
        if (status)
            return status;

        for (k = 1; k < bps - 2; k++) {
            status = check_splitting(state, k);
            if (status)
                return status;
        }
        printf("All checks with %i bit per sample passed.\n", bps);
    }
    return 0;
}